

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  size_type *psVar1;
  bool bVar2;
  vw *pvVar3;
  options_i *poVar4;
  int iVar5;
  svm_params *__s;
  option_group_definition *poVar6;
  typed_option<unsigned_long> *ptVar7;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  typed_option<float> *op_00;
  typed_option<int> *op_01;
  loss_function *plVar8;
  svm_model *psVar9;
  svm_example **ppsVar10;
  ulong uVar11;
  ostream *poVar12;
  double *pdVar13;
  long *plVar14;
  int *piVar15;
  learner<svm_params,_example> *plVar16;
  vw_ostream *pvVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  double dVar20;
  bool ksvm;
  free_ptr<svm_params> params;
  int degree;
  float bandwidth;
  string kernel_type;
  option_group_definition new_options;
  string loss_function;
  bool local_8f1;
  free_ptr<svm_params> local_8f0;
  int local_8e0;
  float local_8dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  vw *local_8b8;
  options_i *local_8b0;
  undefined1 *local_8a8 [2];
  undefined1 local_898 [16];
  string local_888;
  undefined1 *local_868 [2];
  undefined1 local_858 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  string local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  string local_7c8;
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  string local_788;
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  string local_748;
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  string local_708;
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  string local_6c8;
  undefined1 *local_6a8;
  long local_6a0;
  undefined1 local_698 [16];
  option_group_definition local_688;
  string local_650;
  undefined1 *local_630 [2];
  undefined1 local_620 [16];
  string local_610;
  string local_5f0;
  undefined1 local_5d0 [112];
  bool local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  typed_option<unsigned_long> local_530;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<int> local_2b0;
  typed_option<float> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_long> local_d0;
  
  __s = calloc_or_throw<svm_params>(1);
  memset(__s,0,0x90);
  local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<svm_params>;
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  local_8d8._M_string_length = 0;
  local_8d8.field_2._M_local_buf[0] = '\0';
  local_8dc = 1.0;
  local_8e0 = 2;
  local_8f1 = false;
  local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Head_base<0UL,_svm_params_*,_false>.
  _M_head_impl = __s;
  local_6a8 = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"Kernel SVM","");
  local_688.m_name._M_dataplus._M_p = (pointer)&local_688.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_688,local_6a8,local_6a8 + local_6a0);
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6a8 != local_698) {
    operator_delete(local_6a8);
  }
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"ksvm","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_6c8,&local_8f1);
  local_560 = true;
  local_6e8[0] = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"kernel svm","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_688,(typed_option<bool> *)local_5d0);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"reprocess","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_530,&local_708,
             &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->reprocess);
  ptVar7 = VW::config::typed_option<unsigned_long>::default_value(&local_530,1);
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_728,"number of reprocess steps for LASVM","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar6,ptVar7);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"pool_greedy","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_748,
             &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_pool_greedy);
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_768,"use greedy selection on mini pools","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_350);
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"para_active","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_788,
             &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active);
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,"do parallel active learning","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_3f0);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"pool_size","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,&local_7c8,
             &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
  ptVar7 = VW::config::typed_option<unsigned_long>::default_value(&local_d0,1);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,"size of pools for active learning","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar6,ptVar7);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"subsample","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_170,&local_808,
             &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample);
  ptVar7 = VW::config::typed_option<unsigned_long>::default_value(&local_170,1);
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_828,"number of items to subsample from the pool","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar6,ptVar7);
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"kernel","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_490,&local_5f0,&local_8d8);
  local_490.super_base_option.m_keep = true;
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"linear","");
  op = VW::config::
       typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::default_value(&local_490,&local_848);
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_868,"type of kernel (rbf or linear (default))","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar6,op);
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"bandwidth","");
  VW::config::typed_option<float>::typed_option(&local_210,&local_888,&local_8dc);
  local_210.super_base_option.m_keep = true;
  op_00 = VW::config::typed_option<float>::default_value(&local_210,1.0);
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"bandwidth of rbf kernel","");
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar6,op_00);
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"degree","");
  local_8b0 = options;
  VW::config::typed_option<int>::typed_option(&local_2b0,&local_610,&local_8e0);
  local_2b0.super_base_option.m_keep = true;
  local_8b8 = all;
  op_01 = VW::config::typed_option<int>::default_value(&local_2b0,2);
  local_630[0] = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"degree of poly kernel","");
  std::__cxx11::string::_M_assign((string *)&(op_01->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar6,op_01);
  if (local_630[0] != local_620) {
    operator_delete(local_630[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d65b0;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p);
  }
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5f98;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  if (local_868[0] != local_858) {
    operator_delete(local_868[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6008;
  if (local_490.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_490.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5f30;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5f30;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d5fd0;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002d5fd0;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if (local_728[0] != local_718) {
    operator_delete(local_728[0]);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5f30;
  if (local_530.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p);
  }
  pvVar3 = local_8b8;
  if (local_6e8[0] != local_6d8) {
    operator_delete(local_6e8[0]);
  }
  poVar4 = local_8b0;
  local_5d0._0_8_ = &PTR__typed_option_002d5fd0;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  (**poVar4->_vptr_options_i)(poVar4,&local_688);
  if (local_8f1 == false) {
    plVar16 = (learner<svm_params,_example> *)0x0;
  }
  else {
    local_5d0._0_8_ = local_5d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"hinge","");
    if (pvVar3->loss != (loss_function *)0x0) {
      (*pvVar3->loss->_vptr_loss_function[9])();
    }
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_650,local_5d0._0_8_,(pointer)(local_5d0._8_8_ + local_5d0._0_8_));
    plVar8 = getLossFunction(pvVar3,&local_650,0.0);
    pvVar3->loss = plVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p);
    }
    psVar9 = calloc_or_throw<svm_model>(1);
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->model = psVar9;
    psVar9->num_support = 0;
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->maxcache = 0x40000000;
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->loss_sum = 0.0;
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all = pvVar3;
    if (pvVar3->active == true) {
      (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active = true;
    }
    if ((local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active == true) {
      (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_c = 1.0;
    }
    ppsVar10 = calloc_or_throw<svm_example*>
                         ((local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool = ppsVar10;
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_pos = 0;
    psVar1 = &local_530.super_base_option.m_name._M_string_length;
    local_530.super_base_option._vptr_base_option = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"subsample","");
    iVar5 = (*poVar4->_vptr_options_i[1])(poVar4,&local_530);
    if ((char)iVar5 == '\0') {
      bVar2 = (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active;
      if (local_530.super_base_option._vptr_base_option != (_func_int **)psVar1) {
        operator_delete(local_530.super_base_option._vptr_base_option);
      }
      if (bVar2 != false) {
        uVar11 = (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size /
                 pvVar3->all_reduce->total;
        auVar19._8_4_ = (int)(uVar11 >> 0x20);
        auVar19._0_8_ = uVar11;
        auVar19._12_4_ = 0x45300000;
        dVar20 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
        uVar11 = (ulong)dVar20;
        (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample =
             (long)(dVar20 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
      }
    }
    else if (local_530.super_base_option._vptr_base_option != (_func_int **)psVar1) {
      operator_delete(local_530.super_base_option._vptr_base_option);
    }
    uVar18 = -(uint)(pvVar3->l2_lambda == 0.0);
    (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda =
         (float)(~uVar18 & (uint)pvVar3->l2_lambda | uVar18 & 0x3f800000);
    std::__ostream_insert<char,std::char_traits<char>>
              (&((local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message).
                super_ostream,"Lambda = ",9);
    poVar12 = std::ostream::_M_insert<double>
                        ((double)(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>
                                  ._M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pvVar17 = &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar17->super_ostream,"Kernel = ",9);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (&pvVar17->super_ostream,local_8d8._M_dataplus._M_p,
                         local_8d8._M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    iVar5 = std::__cxx11::string::compare((char *)&local_8d8);
    if (iVar5 == 0) {
      (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                (&((local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message).
                  super_ostream,"bandwidth = ",0xc);
      poVar12 = std::ostream::_M_insert<double>((double)local_8dc);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pdVar13 = calloc_or_throw<double>(1);
      (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = pdVar13;
      *(float *)pdVar13 = local_8dc;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_8d8);
      if (iVar5 == 0) {
        (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 2;
        pvVar17 = &(local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>(&pvVar17->super_ostream,"degree = ",9);
        plVar14 = (long *)std::ostream::operator<<(pvVar17,local_8e0);
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
        piVar15 = calloc_or_throw<int>(1);
        (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = piVar15;
        *piVar15 = local_8e0;
      }
      else {
        (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 0;
      }
    }
    pvVar3 = (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all;
    if ((pvVar3->weights).sparse == true) {
      sparse_parameters::stride_shift(&(pvVar3->weights).sparse_weights,0);
    }
    else {
      (pvVar3->weights).dense_weights._stride_shift = 0;
    }
    plVar16 = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                        (&local_8f0,learn,predict,1);
    *(code **)(plVar16 + 0x80) = save_load;
    *(undefined8 *)(plVar16 + 0x70) = *(undefined8 *)(plVar16 + 0x18);
    *(undefined8 *)(plVar16 + 0x78) = *(undefined8 *)(plVar16 + 0x20);
    *(undefined8 *)(plVar16 + 0xb8) = *(undefined8 *)(plVar16 + 0x18);
    *(undefined8 *)(plVar16 + 0xc0) = *(undefined8 *)(plVar16 + 0x20);
    *(code **)(plVar16 + 200) = finish;
    if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
      operator_delete((void *)local_5d0._0_8_);
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_688.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688.m_name._M_dataplus._M_p != &local_688.m_name.field_2) {
    operator_delete(local_688.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p);
  }
  if (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_svm_params_*,_false>._M_head_impl != (svm_params *)0x0) {
    (*(code *)local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_8f0._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar16;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}